

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_base.h
# Opt level: O2

VectorD<long,_3> * __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::GetPositionForCorner
          (VectorD<long,_3> *__return_storage_ptr__,
          MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
          *this,CornerIndex ci)

{
  const_reference pvVar1;
  size_type __n;
  
  if (ci.value_ == 0xffffffff) {
    __n = 0xffffffff;
  }
  else {
    __n = (size_type)
          (((this->mesh_data_).corner_table_)->corner_to_vertex_map_).vector_.
          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[ci.value_].value_;
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::at((this->mesh_data_).vertex_to_data_map_,__n);
  GetPositionForDataId(__return_storage_ptr__,this,*pvVar1);
  return __return_storage_ptr__;
}

Assistant:

VectorD<int64_t, 3> GetPositionForCorner(CornerIndex ci) const {
    DRACO_DCHECK(this->IsInitialized());
    const auto corner_table = mesh_data_.corner_table();
    const auto vert_id = corner_table->Vertex(ci).value();
    const auto data_id = mesh_data_.vertex_to_data_map()->at(vert_id);
    return GetPositionForDataId(data_id);
  }